

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O1

bool bc7decomp::unpack_bc7(void *pBlock,color_rgba *pPixels)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  
  bVar1 = *pBlock;
  uVar5 = 0;
  bVar3 = bVar1 & 1;
  while( true ) {
    if (bVar3 != 0) {
      uVar2 = (*(code *)((long)&DAT_00121dd0 + (long)(int)(&DAT_00121dd0)[uVar5]))
                        (&DAT_00121dd0,pBlock,pPixels);
      return (bool)uVar2;
    }
    uVar4 = (uint)uVar5;
    if (uVar4 == 7) break;
    bVar3 = (byte)uVar5;
    uVar5 = (ulong)(uVar4 + 1);
    bVar3 = bVar1 >> (bVar3 & 0x1f) & 2;
  }
  return (bool)(uVar4 < 7 & bVar1);
}

Assistant:

bool unpack_bc7(const void *pBlock, color_rgba *pPixels)
{
	const uint32_t first_byte = static_cast<const uint8_t*>(pBlock)[0];

	for (uint32_t mode = 0; mode <= 7; mode++)
	{
		if (first_byte & (1U << mode))
		{
			switch (mode)
			{
			case 0:
			case 2:
				return unpack_bc7_mode0_2(mode, pBlock, pPixels);
			case 1:
			case 3:
			case 7:
				return unpack_bc7_mode1_3_7(mode, pBlock, pPixels);
			case 4:
			case 5:
				return unpack_bc7_mode4_5(mode, pBlock, pPixels);
			case 6:
				return unpack_bc7_mode6(pBlock, pPixels);
			default:
				break;
			}
		}
	}

	return false;
}